

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O2

Spectrum __thiscall
CMU462::GlassBSDF::sample_f(GlassBSDF *this,Vector3D *wo,Vector3D *wi,float *pdf)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Spectrum SVar8;
  Vector3D wi_refract;
  
  iVar1 = (*(this->super_BSDF)._vptr_BSDF[5])(*(undefined4 *)&(this->super_BSDF).field_0x14);
  if ((char)iVar1 == '\0') {
    (*(this->super_BSDF)._vptr_BSDF[4])(this,wo,wi);
    *pdf = 1.0;
    SVar8 = Spectrum::operator*(&this->reflectance,(float)(1.0 / ABS(wi->z)));
    fVar5 = SVar8.b;
    fVar4 = SVar8.r;
    fVar3 = SVar8.g;
  }
  else {
    fVar3 = *(float *)&(this->super_BSDF).field_0x14;
    if (wo->z < 0.0) {
      fVar4 = 1.0;
    }
    else {
      fVar4 = fVar3;
      fVar3 = 1.0;
    }
    iVar2 = (int)wo->z;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    fVar6 = (float)iVar1;
    fVar7 = (fVar4 * fVar6 - fVar3 * 0.0) / (fVar4 * fVar6 + fVar3 * 0.0);
    fVar5 = (fVar3 * fVar6 - fVar4 * 0.0) / (fVar3 * fVar6 + fVar4 * 0.0);
    fVar5 = (fVar7 * fVar7 + fVar5 * fVar5) * 0.5;
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    if (1.0 <= fVar5) {
      fVar5 = 1.0;
    }
    iVar1 = rand();
    if (fVar5 <= (float)iVar1 / 2.1474836e+09) {
      wi->z = 0.0;
      wi->x = 0.0;
      wi->y = 0.0;
      fVar5 = 1.0 - fVar5;
      *pdf = fVar5;
      SVar8 = Spectrum::operator*(&this->transmittance,(((fVar4 * fVar4) / fVar3) / fVar3) / fVar6);
      fVar4 = fVar5 * SVar8.r;
      fVar3 = fVar5 * SVar8.g;
      fVar5 = SVar8.b * fVar5;
    }
    else {
      (*(this->super_BSDF)._vptr_BSDF[4])(this,wo,wi);
      *pdf = fVar5;
      SVar8 = Spectrum::operator*(&this->reflectance,fVar5);
      fVar3 = (float)(1.0 / ABS(wi->z));
      fVar5 = SVar8.b * fVar3;
      fVar4 = fVar3 * SVar8.r;
      fVar3 = fVar3 * SVar8.g;
    }
  }
  SVar8.g = fVar3;
  SVar8.r = fVar4;
  SVar8.b = fVar5;
  return SVar8;
}

Assistant:

Spectrum GlassBSDF::sample_f(const Vector3D& wo, Vector3D* wi, float* pdf) {
	// TODO (PathTracer):
	Vector3D wi_refract;
	bool external = refract(wo, &wi_refract, ior);
	if (external) {
		float ni, nt, cos_theta_i, cos_theta_t;
		if (wo.z >= 0) {
			ni = 1.0;
			nt = ior;
		}
		else {
			ni = ior;
			nt = 1.0;
		}
		cos_theta_t = abs(wi_refract.z);
		cos_theta_i = abs(wo.z);

		// Compute Fresnel coefficient.
		float r_parallel = (nt* cos_theta_i - ni * cos_theta_t) / (nt * cos_theta_i + ni * cos_theta_t);
		float r_perpendicular = (ni* cos_theta_i - nt * cos_theta_t) / (ni * cos_theta_i + nt * cos_theta_t);
		float Fr = 0.5f*(r_parallel*r_parallel + r_perpendicular * r_perpendicular);
		Fr = std::min(1.0f, std::max(0.0f, Fr));

		// decide either reflect or refract based on it
		if ((double(rand()) / RAND_MAX) < Fr) {
			reflect(wo, wi);
			*pdf = Fr;
			return Fr * reflectance * (1.0 / abs_cos_theta(*wi));
		}
		else {
			*wi = wi_refract;
			*pdf = 1.0f - Fr;
			return transmittance * (nt * nt / ni / ni / cos_theta_i) * (1.0f - Fr);
		}
	}
	else {
		reflect(wo, wi);
		*pdf = 1.0f;
		return reflectance * (1.0 / abs_cos_theta(*wi));
	}
}